

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool calculateSimilartyMap<short>
               (int32_t keyPressWidth_samples,int32_t alignWindow_samples,
               int32_t offsetFromPeak_samples,TKeyPressCollectionT<short> *keyPresses,
               TSimilarityMap *res)

{
  pointer pvVar1;
  int iVar2;
  TSimilarityMap *__range1;
  iterator __end1;
  pointer ptVar3;
  vector<stMatch,_std::allocator<stMatch>_> *x;
  pointer this;
  pointer ptVar4;
  int nPresses;
  int nWorkers;
  int a;
  int w;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  int local_a0;
  int local_9c;
  int local_98;
  int32_t local_94;
  int32_t local_90;
  int32_t local_8c;
  thread local_88;
  vector<std::thread,_std::allocator<std::thread>_> local_80;
  type local_68;
  
  local_9c = (int)((ulong)((long)(keyPresses->
                                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ).
                                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(keyPresses->
                                super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ).
                                super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  local_94 = alignWindow_samples;
  local_90 = keyPressWidth_samples;
  local_8c = offsetFromPeak_samples;
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::_M_erase_at_end(res,(res->
                        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::resize(res,(long)local_9c);
  pvVar1 = (res->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this = (res->
              super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; this != pvVar1; this = this + 1) {
    std::vector<stMatch,_std::allocator<stMatch>_>::resize(this,(long)local_9c);
  }
  local_98 = std::thread::hardware_concurrency();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_80,(long)local_98,(allocator_type *)&local_68);
  local_a0 = 0;
  ptVar3 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar4 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    do {
      ptVar3 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = local_a0;
      local_68.nPresses = &local_9c;
      local_68.nWorkers = &local_98;
      local_68.offsetFromPeak_samples = &local_8c;
      local_68.w = &local_90;
      local_68.a = &local_94;
      local_68.res = res;
      local_68.keyPresses = keyPresses;
      std::thread::
      thread<calculateSimilartyMap<short>(int,int,int,stKeyPressCollection<short>&,std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>&)::_lambda(int)_1_,int&,void>
                (&local_88,&local_68,&local_a0);
      if (ptVar3[iVar2]._M_id._M_thread != 0) {
        std::terminate();
      }
      ptVar3[iVar2]._M_id._M_thread = (native_handle_type)local_88._M_id._M_thread;
      local_a0 = local_a0 + 1;
      ptVar3 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar4 = local_80.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_a0 <
             (int)((ulong)((long)local_80.
                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_80.
                                super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  for (; ptVar4 != ptVar3; ptVar4 = ptVar4 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_80);
  return true;
}

Assistant:

bool calculateSimilartyMap(
        const int32_t keyPressWidth_samples,
        const int32_t alignWindow_samples,
        const int32_t offsetFromPeak_samples,
        TKeyPressCollectionT<T> & keyPresses,
        TSimilarityMap & res) {
    int nPresses = keyPresses.size();

    int w = keyPressWidth_samples;
    int a = alignWindow_samples;

    res.clear();
    res.resize(nPresses);
    for (auto & x : res) x.resize(nPresses);

#ifdef __EMSCRIPTEN__
    int nWorkers = std::min(kMaxThreads, std::max(1, int(std::thread::hardware_concurrency()) - 2));
#else
    int nWorkers = std::thread::hardware_concurrency();
#endif

    std::vector<std::thread> workers(nWorkers);
    for (int iw = 0; iw < (int) workers.size(); ++iw) {
        auto & worker = workers[iw];
        worker = std::thread([&](int ith) {
            for (int i = ith; i < nPresses; i += nWorkers) {
                res[i][i].cc = 1.0f;
                res[i][i].offset = 0;

                const auto & waveform0 = keyPresses[i].waveform;
                const auto & pos0      = keyPresses[i].pos;

                auto & avgcc = keyPresses[i].ccAvg;

                const auto samples0 = waveform0.samples;

                for (int j = i + 1; j < nPresses; ++j) {
                    if (i == j) continue;

                    const auto waveform1 = keyPresses[j].waveform;
                    const auto pos1      = keyPresses[j].pos;

                    const auto samples1 = waveform1.samples;
                    const auto ret = findBestCC(TWaveformViewT<T> { samples0 + pos0 + offsetFromPeak_samples - w,     2*w },
                                                TWaveformViewT<T> { samples1 + pos1 + offsetFromPeak_samples - w - a, 2*w + 2*a }, a);

                    const auto bestcc     = std::get<0>(ret);
                    const auto bestoffset = std::get<1>(ret);

                    res[i][j].cc = bestcc;
                    res[i][j].offset = bestoffset;

                    res[j][i].cc = bestcc;
                    res[j][i].offset = -bestoffset;

                    avgcc += bestcc;
                }
                avgcc /= (nPresses - 1);
            }
        }, iw);
    }

    for (auto & worker : workers) worker.join();

    return true;
}